

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O2

Aig_Obj_t * Aig_ObjCreateGhost(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1,Aig_Type_t Type)

{
  int iVar1;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pAVar2;
  
  if ((Type == AIG_OBJ_AND) &&
     (iVar1 = Aig_ObjIsConst1((Aig_Obj_t *)((ulong)p0 & 0xfffffffffffffffe)), iVar1 != 0)) {
    __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                  ,0x15d,
                  "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                 );
  }
  if (p1 == (Aig_Obj_t *)0x0) {
    pObj = (Aig_Obj_t *)0x0;
  }
  else {
    pObj = (Aig_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
    iVar1 = Aig_ObjIsConst1(pObj);
    if (iVar1 != 0) {
      __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x15e,
                    "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                   );
    }
  }
  if ((Aig_Obj_t *)((ulong)p0 & 0xfffffffffffffffe) != pObj) {
    *(ulong *)&(p->Ghost).field_0x18 =
         *(ulong *)&(p->Ghost).field_0x18 & 0xfffffffffffffff8 | (ulong)(Type & AIG_OBJ_VOID);
    pAVar2 = p1;
    if ((p1 != (Aig_Obj_t *)0x0) &&
       (pObj->Id <= ((Aig_Obj_t *)((ulong)p0 & 0xfffffffffffffffe))->Id)) {
      pAVar2 = p0;
      p0 = p1;
    }
    (p->Ghost).pFanin0 = p0;
    (p->Ghost).pFanin1 = pAVar2;
    return &p->Ghost;
  }
  __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                ,0x15f,
                "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)");
}

Assistant:

static inline Aig_Obj_t *  Aig_ObjCreateGhost( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1, Aig_Type_t Type )    
{
    Aig_Obj_t * pGhost;
    assert( Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0)) );
    assert( p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1)) );
    assert( Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1) );
    pGhost = Aig_ManGhost(p);
    pGhost->Type = Type;
    if ( p1 == NULL || Aig_Regular(p0)->Id < Aig_Regular(p1)->Id )
    {
        pGhost->pFanin0 = p0;
        pGhost->pFanin1 = p1;
    }
    else
    {
        pGhost->pFanin0 = p1;
        pGhost->pFanin1 = p0;
    }
    return pGhost;
}